

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,color4d *value)

{
  bool bVar1;
  double4 v;
  array<double,_4UL> local_28;
  
  bVar1 = ParseBasicTypeTuple<double,4ul>(this,&local_28);
  if (bVar1) {
    value->r = local_28._M_elems[0];
    value->g = local_28._M_elems[1];
    value->b = local_28._M_elems[2];
    value->a = local_28._M_elems[3];
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(value::color4d *value) {
  value::double4 v;
  if (ParseBasicTypeTuple(&v)) {
    value->r = v[0];
    value->g = v[1];
    value->b = v[2];
    value->a = v[3];
    return true;
  }
  return false;
}